

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PrimRectUV(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImVec2 *uv_a,ImVec2 *uv_c,ImU32 col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx IVar10;
  
  fVar1 = a->x;
  fVar2 = a->y;
  fVar3 = c->x;
  fVar4 = c->y;
  fVar5 = uv_a->x;
  fVar6 = uv_a->y;
  fVar7 = uv_c->x;
  fVar8 = uv_c->y;
  IVar10 = (ImDrawIdx)this->_VtxCurrentIdx;
  *this->_IdxWritePtr = IVar10;
  this->_IdxWritePtr[1] = IVar10 + 1;
  this->_IdxWritePtr[2] = IVar10 + 2;
  this->_IdxWritePtr[3] = IVar10;
  this->_IdxWritePtr[4] = IVar10 + 2;
  this->_IdxWritePtr[5] = IVar10 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = *uv_a;
  this->_VtxWritePtr->col = col;
  pIVar9 = this->_VtxWritePtr;
  pIVar9[1].pos.x = fVar3;
  pIVar9[1].pos.y = fVar2;
  pIVar9 = this->_VtxWritePtr;
  pIVar9[1].uv.x = fVar7;
  pIVar9[1].uv.y = fVar6;
  this->_VtxWritePtr[1].col = col;
  this->_VtxWritePtr[2].pos = *c;
  this->_VtxWritePtr[2].uv = *uv_c;
  this->_VtxWritePtr[2].col = col;
  pIVar9 = this->_VtxWritePtr;
  pIVar9[3].pos.x = fVar1;
  pIVar9[3].pos.y = fVar4;
  pIVar9 = this->_VtxWritePtr;
  pIVar9[3].uv.x = fVar5;
  pIVar9[3].uv.y = fVar8;
  this->_VtxWritePtr[3].col = col;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_VtxWritePtr = this->_VtxWritePtr + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimRectUV(const ImVec2& a, const ImVec2& c, const ImVec2& uv_a, const ImVec2& uv_c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv_b(uv_c.x, uv_a.y), uv_d(uv_a.x, uv_c.y);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv_a; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv_b; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv_c; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv_d; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}